

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeFloatArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  size_t sVar7;
  AuxArray<double> local_60;
  double value;
  byte *pbStack_50;
  uint index;
  byte *current;
  byte *content;
  AuxArray<double> *pAStack_38;
  uint count;
  AuxArray<double> *result;
  SerializedFloatArray *serialized;
  ByteBlock *deserializeInto_local;
  byte *buffer_local;
  ScriptContext *scriptContext_local;
  ByteCodeBufferReader *this_local;
  
  uVar1 = *(uint *)buffer;
  result = (AuxArray<double> *)buffer;
  serialized = (SerializedFloatArray *)deserializeInto;
  deserializeInto_local = (ByteBlock *)buffer;
  buffer_local = (byte *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12c2,
                                "(serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pbVar6 = ByteBlock::GetBuffer((ByteBlock *)serialized);
  pAStack_38 = (AuxArray<double> *)(pbVar6 + result->count);
  content._4_4_ = *(uint32 *)&result->field_0x5;
  pAStack_38->count = content._4_4_;
  uVar1 = result->count;
  sVar7 = AuxArray<double>::GetDataSize(pAStack_38);
  uVar4 = ByteBlock::GetLength((ByteBlock *)serialized);
  if ((ulong)uVar4 < uVar1 + sVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12c6,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pbStack_50 = (byte *)((long)&result[1].count + 1);
  current = pbStack_50;
  for (value._4_4_ = 0; value._4_4_ < content._4_4_; value._4_4_ = value._4_4_ + 1) {
    pbStack_50 = ReadDouble(this,pbStack_50,(double *)&local_60);
    pAStack_38[(ulong)value._4_4_ + 1] = local_60;
  }
  return pbStack_50;
}

Assistant:

const byte *
    DeserializeFloatArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const SerializedFloatArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxFltArray);
#endif
        Assert(serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength());
        auto result = (AuxArray<double> *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->floatCount;
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            double value;
            current = ReadDouble(current, &value);
            result->elements[index] = value;
        }
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxFltArray);
#endif
        return current;
    }